

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O2

void __thiscall TestRunner::RunAll(TestRunner *this,TestCase **array,int numTests)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)numTests;
  if (numTests < 1) {
    uVar2 = uVar3;
  }
  while( true ) {
    if (uVar2 == uVar3) {
      return;
    }
    bVar1 = TestCase::Start(array[uVar3]);
    if (!bVar1) break;
    if (array[uVar3] != (TestCase *)0x0) {
      (*array[uVar3]->_vptr_TestCase[1])();
    }
    uVar3 = uVar3 + 1;
  }
  exit(1);
}

Assistant:

void RunAll( TestCase **array, int numTests )
	{
		for( int i = 0; i < numTests; i++ )
		{
			LOG_NOTICE( "Running test %s", array[ i ]->GetTestName() );
			if ( array[ i ]->Start() == false )
			{
				exit( EXIT_FAILURE );
			}
			delete array[ i ];
		}
	}